

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::FieldMaskUtil::IsPathInFieldMask
          (FieldMaskUtil *this,StringPiece path,FieldMask *mask)

{
  StringPiece x;
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  Type *str;
  stringpiece_ssize_type sVar4;
  int index;
  StringPiece x_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  StringPiece local_78;
  StringPiece local_68;
  long local_58;
  RepeatedPtrFieldBase *local_50;
  undefined1 local_48 [8];
  StringPiece path_local;
  
  local_58 = path.length_;
  path_local.ptr_ = path.ptr_;
  local_50 = (RepeatedPtrFieldBase *)(local_58 + 0x10);
  local_48 = (undefined1  [8])this;
  for (index = 0; path_local.length_._4_4_ = *(int *)(local_58 + 0x18),
      index < path_local.length_._4_4_; index = index + 1) {
    str = protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(local_50,index)
    ;
    x.length_ = (stringpiece_ssize_type)path_local.ptr_;
    x.ptr_ = (char *)local_48;
    StringPiece::StringPiece<std::allocator<char>>(&local_78,str);
    bVar2 = operator==(x,local_78);
    if (bVar2) break;
    if ((char *)str->_M_string_length < path_local.ptr_) {
      local_68 = StringPiece::substr((StringPiece *)local_48,0,
                                     (size_type)((char *)str->_M_string_length + 1));
      std::operator+(&local_98,str,".");
      _Var1._M_p = local_98._M_dataplus._M_p;
      sVar4 = StringPiece::CheckedSsizeTFromSizeT(local_98._M_string_length);
      x_00.length_ = sVar4;
      x_00.ptr_ = _Var1._M_p;
      iVar3 = StringPiece::compare(&local_68,x_00);
      std::__cxx11::string::~string((string *)&local_98);
      if (iVar3 == 0) break;
    }
  }
  return index < path_local.length_._4_4_;
}

Assistant:

bool FieldMaskUtil::IsPathInFieldMask(StringPiece path,
                                      const FieldMask& mask) {
  for (int i = 0; i < mask.paths_size(); ++i) {
    const std::string& mask_path = mask.paths(i);
    if (path == mask_path) {
      return true;
    } else if (mask_path.length() < path.length()) {
      // Also check whether mask.paths(i) is a prefix of path.
      if (path.substr(0, mask_path.length() + 1).compare(mask_path + ".") ==
          0) {
        return true;
      }
    }
  }
  return false;
}